

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

ostream * tcu::operator<<(ostream *stream,Vector<float,_2> *vec)

{
  std::__ostream_insert<char,std::char_traits<char>>(stream,"(",1);
  std::ostream::_M_insert<double>((double)vec->m_data[0]);
  std::__ostream_insert<char,std::char_traits<char>>(stream,", ",2);
  std::ostream::_M_insert<double>((double)vec->m_data[1]);
  std::__ostream_insert<char,std::char_traits<char>>(stream,")",1);
  return stream;
}

Assistant:

std::ostream& operator<< (std::ostream& stream, const tcu::Vector<T, Size>& vec)
{
	stream << "(";
	for (int i = 0; i < Size; i++)
	{
		if (i != 0)
			stream << ", ";
		stream << vec.m_data[i];
	}
	stream << ")";
	return stream;
}